

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

PointerType * LLVMBC::PointerType::get(Type *pointee,uint addr_space)

{
  LLVMContext *this;
  pointer ppTVar1;
  PointerType *pPVar2;
  uint in_ESI;
  Type *in_RDI;
  pointer ppTVar3;
  Vector<Type_*> *__range1;
  uint local_4c;
  vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *local_48;
  Type *local_40;
  PointerType *local_38;
  
  this = in_RDI->context;
  local_48 = (vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
             &this->type_cache;
  ppTVar3 = (this->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (this->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppTVar3 == ppTVar1) {
      pPVar2 = LLVMContext::construct<LLVMBC::PointerType,LLVMBC::Type*&,unsigned_int&>
                         (this,&local_40,&local_4c);
      local_38 = pPVar2;
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      emplace_back<LLVMBC::Type*>(local_48,(Type **)&local_38);
      return pPVar2;
    }
    if ((((*ppTVar3)->type_id == PointerTyID) &&
        (pPVar2 = cast<LLVMBC::PointerType>(*ppTVar3), (pPVar2->super_Type).address_space == in_ESI)
        ) && (pPVar2->contained_type == in_RDI)) break;
    ppTVar3 = ppTVar3 + 1;
  }
  return pPVar2;
}

Assistant:

PointerType *PointerType::get(Type *pointee, unsigned addr_space)
{
	auto &context = pointee->getContext();
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::PointerTyID)
		{
			auto *pointer_type = cast<PointerType>(type);
			if (pointer_type->getAddressSpace() == addr_space && pointer_type->getElementType() == pointee)
				return pointer_type;
		}
	}

	auto *type = context.construct<PointerType>(pointee, addr_space);
	cache.push_back(type);
	return type;
}